

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImFontGlyph *pIVar5;
  uint col_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar5 = FindGlyph(this,c);
  if ((pIVar5 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar5 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar5 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    auVar7 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)size),6);
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = 0x3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    auVar7 = vblendvps_avx(ZEXT416((uint)(size / this->FontSize)),auVar9,auVar7);
    ImDrawList::PrimReserve(draw_list,6,4);
    local_58 = pos.x;
    fStack_54 = pos.y;
    fStack_50 = (float)in_XMM1_Qb;
    fStack_4c = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar6._0_4_ = (int)local_58;
    auVar6._4_4_ = (int)fStack_54;
    auVar6._8_4_ = (int)fStack_50;
    auVar6._12_4_ = (int)fStack_4c;
    auVar6 = vcvtdq2ps_avx(auVar6);
    uVar1 = pIVar5->X0;
    uVar3 = pIVar5->Y0;
    local_68 = auVar7._0_4_;
    auVar8._0_4_ = (float)uVar1 * local_68 + auVar6._0_4_;
    auVar8._4_4_ = (float)uVar3 * local_68 + auVar6._4_4_;
    auVar8._8_4_ = local_68 * 0.0 + auVar6._8_4_;
    auVar8._12_4_ = local_68 * 0.0 + auVar6._12_4_;
    local_30 = (ImVec2)vmovlps_avx(auVar8);
    uVar2 = pIVar5->X1;
    uVar4 = pIVar5->Y1;
    auVar7._0_4_ = (float)uVar2 * local_68 + auVar6._0_4_;
    auVar7._4_4_ = (float)uVar4 * local_68 + auVar6._4_4_;
    auVar7._8_4_ = local_68 * 0.0 + auVar6._8_4_;
    auVar7._12_4_ = local_68 * 0.0 + auVar6._12_4_;
    local_38 = (ImVec2)vmovlps_avx(auVar7);
    local_40.x = pIVar5->U0;
    local_40.y = pIVar5->V0;
    local_48.x = pIVar5->U1;
    local_48.y = pIVar5->V1;
    ImDrawList::PrimRectUV(draw_list,&local_30,&local_38,&local_40,&local_48,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}